

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_freeCDict(ZSTD_CDict *cdict)

{
  ZSTD_freeFunction p_Var1;
  void *pvVar2;
  ZSTD_CDict *ptr;
  ZSTD_CDict *pZVar3;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  
  if (cdict != (ZSTD_CDict *)0x0) {
    p_Var1 = (cdict->customMem).customFree;
    pvVar2 = (cdict->customMem).opaque;
    customMem_00 = cdict->customMem;
    customMem = cdict->customMem;
    ptr = (ZSTD_CDict *)(cdict->workspace).workspace;
    if (cdict < ptr) {
      (cdict->workspace).tableValidEnd = (void *)0x0;
      (cdict->workspace).allocStart = (void *)0x0;
      (cdict->workspace).allocFailed = 0;
      (cdict->workspace).workspaceOversizedDuration = 0;
      *(undefined8 *)&(cdict->workspace).phase = 0;
      (cdict->workspace).workspace = (void *)0x0;
      (cdict->workspace).workspaceEnd = (void *)0x0;
      (cdict->workspace).objectEnd = (void *)0x0;
      (cdict->workspace).tableEnd = (void *)0x0;
      ZSTD_free(ptr,customMem);
    }
    else {
      pZVar3 = (ZSTD_CDict *)(cdict->workspace).workspaceEnd;
      (cdict->workspace).tableValidEnd = (void *)0x0;
      (cdict->workspace).allocStart = (void *)0x0;
      (cdict->workspace).allocFailed = 0;
      (cdict->workspace).workspaceOversizedDuration = 0;
      *(undefined8 *)&(cdict->workspace).phase = 0;
      (cdict->workspace).workspace = (void *)0x0;
      (cdict->workspace).workspaceEnd = (void *)0x0;
      (cdict->workspace).objectEnd = (void *)0x0;
      (cdict->workspace).tableEnd = (void *)0x0;
      ZSTD_free(ptr,customMem_00);
      if (cdict <= pZVar3) {
        return 0;
      }
    }
    if (p_Var1 == (ZSTD_freeFunction)0x0) {
      free(cdict);
    }
    else {
      (*p_Var1)(pvVar2,cdict);
    }
  }
  return 0;
}

Assistant:

size_t ZSTD_freeCDict(ZSTD_CDict* cdict)
{
    if (cdict==NULL) return 0;   /* support free on NULL */
    {   ZSTD_customMem const cMem = cdict->customMem;
        int cdictInWorkspace = ZSTD_cwksp_owns_buffer(&cdict->workspace, cdict);
        ZSTD_cwksp_free(&cdict->workspace, cMem);
        if (!cdictInWorkspace) {
            ZSTD_free(cdict, cMem);
        }
        return 0;
    }
}